

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

archive_string * archive_strcat(archive_string *as,void *p)

{
  archive_string *paVar1;
  size_t unaff_retaddr;
  
  paVar1 = archive_strncat(as,p,unaff_retaddr);
  return paVar1;
}

Assistant:

struct archive_string *
archive_strcat(struct archive_string *as, const void *p)
{
	/* strcat is just strncat without an effective limit. 
	 * Assert that we'll never get called with a source
	 * string over 16MB.
	 * TODO: Review all uses of strcat in the source
	 * and try to replace them with strncat().
	 */
	return archive_strncat(as, p, 0x1000000);
}